

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmELF.cxx
# Opt level: O2

void __thiscall
cmELFInternalImpl<cmELFTypes32>::PrintInfo(cmELFInternalImpl<cmELFTypes32> *this,ostream *os)

{
  ByteOrderType BVar1;
  ostream *poVar2;
  ulong uVar3;
  char *pcVar4;
  
  poVar2 = std::operator<<(os,"ELF ");
  std::operator<<(poVar2,"32-bit");
  BVar1 = (this->super_cmELFInternal).ByteOrder;
  if (BVar1 == ByteOrderMSB) {
    pcVar4 = " MSB";
  }
  else {
    if (BVar1 != ByteOrderLSB) goto LAB_0011956b;
    pcVar4 = " LSB";
  }
  std::operator<<(os,pcVar4);
LAB_0011956b:
  uVar3 = (ulong)(this->super_cmELFInternal).ELFType;
  if (uVar3 < 7) {
    std::operator<<(os,(&PTR_anon_var_dwarf_433e4_002088c0)[uVar3]);
  }
  std::operator<<(os,"\n");
  return;
}

Assistant:

void PrintInfo(std::ostream& os) const override
  {
    os << "ELF " << Types::GetName();
    if (this->ByteOrder == ByteOrderMSB) {
      os << " MSB";
    } else if (this->ByteOrder == ByteOrderLSB) {
      os << " LSB";
    }
    switch (this->ELFType) {
      case cmELF::FileTypeInvalid:
        os << " invalid file";
        break;
      case cmELF::FileTypeRelocatableObject:
        os << " relocatable object";
        break;
      case cmELF::FileTypeExecutable:
        os << " executable";
        break;
      case cmELF::FileTypeSharedLibrary:
        os << " shared library";
        break;
      case cmELF::FileTypeCore:
        os << " core file";
        break;
      case cmELF::FileTypeSpecificOS:
        os << " os-specific type";
        break;
      case cmELF::FileTypeSpecificProc:
        os << " processor-specific type";
        break;
    }
    os << "\n";
  }